

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O0

void Abc_NtkAddFrame(Abc_Ntk_t *pNtkFrames,Abc_Ntk_t *pNtk,int iFrame)

{
  Abc_Aig_t *pMan;
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *p1;
  Abc_Obj_t *pAVar6;
  char *pcVar7;
  int local_44;
  int i;
  Abc_Obj_t *pLatch;
  Abc_Obj_t *pNode;
  char Buffer [10];
  int NodeBef;
  int fVerbose;
  int iFrame_local;
  Abc_Ntk_t *pNtk_local;
  Abc_Ntk_t *pNtkFrames_local;
  
  Buffer[6] = '\0';
  Buffer[7] = '\0';
  Buffer[8] = '\0';
  Buffer[9] = '\0';
  Buffer._2_4_ = Abc_NtkNodeNum(pNtkFrames);
  sprintf((char *)((long)&pNode + 2),"_%02d",(ulong)(uint)iFrame);
  for (local_44 = 0; iVar2 = Abc_NtkPiNum(pNtk), local_44 < iVar2; local_44 = local_44 + 1) {
    pAVar5 = Abc_NtkPi(pNtk,local_44);
    pAVar6 = Abc_NtkDupObj(pNtkFrames,pAVar5,0);
    pcVar7 = Abc_ObjName(pAVar5);
    Abc_ObjAssignName(pAVar6,pcVar7,(char *)((long)&pNode + 2));
  }
  for (local_44 = 0; iVar2 = Vec_PtrSize(pNtk->vObjs), local_44 < iVar2; local_44 = local_44 + 1) {
    pAVar5 = Abc_NtkObj(pNtk,local_44);
    if ((pAVar5 != (Abc_Obj_t *)0x0) && (iVar2 = Abc_AigNodeIsAnd(pAVar5), iVar2 != 0)) {
      pMan = (Abc_Aig_t *)pNtkFrames->pManFunc;
      pAVar6 = Abc_ObjChild0Copy(pAVar5);
      p1 = Abc_ObjChild1Copy(pAVar5);
      pAVar6 = Abc_AigAnd(pMan,pAVar6,p1);
      (pAVar5->field_6).pCopy = pAVar6;
    }
  }
  for (local_44 = 0; iVar2 = Abc_NtkPoNum(pNtk), local_44 < iVar2; local_44 = local_44 + 1) {
    pAVar6 = Abc_NtkPo(pNtk,local_44);
    pAVar5 = Abc_NtkDupObj(pNtkFrames,pAVar6,0);
    pcVar7 = Abc_ObjName(pAVar6);
    Abc_ObjAssignName(pAVar5,pcVar7,(char *)((long)&pNode + 2));
    pAVar5 = (pAVar6->field_6).pCopy;
    pAVar6 = Abc_ObjChild0Copy(pAVar6);
    Abc_ObjAddFanin(pAVar5,pAVar6);
  }
  for (local_44 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_44 < iVar2; local_44 = local_44 + 1) {
    pAVar5 = Abc_NtkBox(pNtk,local_44);
    iVar2 = Abc_ObjIsLatch(pAVar5);
    if (iVar2 != 0) {
      pAVar6 = Abc_ObjFanin0(pAVar5);
      pAVar6 = Abc_ObjChild0Copy(pAVar6);
      (pAVar5->field_6).pCopy = pAVar6;
    }
  }
  for (local_44 = 0; iVar2 = Vec_PtrSize(pNtk->vBoxes), local_44 < iVar2; local_44 = local_44 + 1) {
    pAVar5 = Abc_NtkBox(pNtk,local_44);
    iVar2 = Abc_ObjIsLatch(pAVar5);
    if (iVar2 != 0) {
      aVar1 = pAVar5->field_6;
      pAVar5 = Abc_ObjFanout0(pAVar5);
      pAVar5->field_6 = aVar1;
    }
  }
  if (Buffer._6_4_ != 0) {
    uVar3 = Abc_NtkNodeNum(pNtk);
    iVar2 = Abc_NtkNodeNum(pNtkFrames);
    uVar4 = iVar2 - Buffer._2_4_;
    pAVar5 = Abc_NtkPo(pNtk,0);
    pAVar5 = Abc_ObjFanin0(pAVar5);
    iVar2 = Abc_AigNodeIsConst((pAVar5->field_6).pCopy);
    pcVar7 = "unknown";
    if (iVar2 != 0) {
      pcVar7 = "proof";
    }
    printf("F = %4d : Total = %6d. Nodes = %6d. Prop = %s.\n",(ulong)(uint)iFrame,(ulong)uVar3,
           (ulong)uVar4,pcVar7);
  }
  return;
}

Assistant:

void Abc_NtkAddFrame( Abc_Ntk_t * pNtkFrames, Abc_Ntk_t * pNtk, int iFrame )
{
    int fVerbose = 0;
    int NodeBef = Abc_NtkNodeNum(pNtkFrames);
    char Buffer[10];
    Abc_Obj_t * pNode, * pLatch;
    int i;
    // create the prefix to be added to the node names
    sprintf( Buffer, "_%02d", iFrame );
    // add the new PI nodes
    Abc_NtkForEachPi( pNtk, pNode, i )
        Abc_ObjAssignName( Abc_NtkDupObj(pNtkFrames, pNode, 0), Abc_ObjName(pNode), Buffer );
    // add the internal nodes
    Abc_AigForEachAnd( pNtk, pNode, i )
        pNode->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkFrames->pManFunc, Abc_ObjChild0Copy(pNode), Abc_ObjChild1Copy(pNode) );
    // add the new POs
    Abc_NtkForEachPo( pNtk, pNode, i )
    {
        Abc_ObjAssignName( Abc_NtkDupObj(pNtkFrames, pNode, 0), Abc_ObjName(pNode), Buffer );
        Abc_ObjAddFanin( pNode->pCopy, Abc_ObjChild0Copy(pNode) );
    }
    // transfer the implementation of the latch inputs to the latch outputs
    Abc_NtkForEachLatch( pNtk, pLatch, i )
        pLatch->pCopy = Abc_ObjChild0Copy(Abc_ObjFanin0(pLatch));
    Abc_NtkForEachLatch( pNtk, pLatch, i )
        Abc_ObjFanout0(pLatch)->pCopy = pLatch->pCopy;
    // nodes after
    if ( fVerbose )
    printf( "F = %4d : Total = %6d. Nodes = %6d. Prop = %s.\n", 
        iFrame, Abc_NtkNodeNum(pNtk), Abc_NtkNodeNum(pNtkFrames)-NodeBef, 
        Abc_AigNodeIsConst( Abc_ObjFanin0(Abc_NtkPo(pNtk,0))->pCopy ) ? "proof" : "unknown" );
}